

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O1

bool __thiscall
httplib::ClientImpl::process_request
          (ClientImpl *this,Stream *strm,Request *req,Response *res,bool close_connection,
          Error *error)

{
  undefined1 *puVar1;
  Error *pEVar2;
  ClientImpl *this_00;
  Request *x;
  bool bVar3;
  int iVar4;
  __ssize_t _Var5;
  size_t sVar6;
  code *pcVar7;
  Response *__stream;
  size_t *extraout_RDX;
  size_t *__n;
  size_t *extraout_RDX_00;
  size_t *extraout_RDX_01;
  Stream *__lineptr;
  char *__s;
  pair<std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Rb_tree_const_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  pVar8;
  int dummy_status;
  char buf [2048];
  _Any_data local_8d8;
  code *local_8c8;
  code *pcStack_8c0;
  _Any_data local_8b8;
  code *local_8a8;
  code *local_8a0;
  stream_line_reader local_890;
  Error *local_850;
  ClientImpl *local_848;
  Request *local_840;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_838;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_828 [127];
  
  bVar3 = write_request(this,strm,req,close_connection,error);
  if (!bVar3) {
    return false;
  }
  __stream = res;
  __lineptr = strm;
  bVar3 = read_response_line(this,strm,req,res);
  if (!bVar3) {
LAB_0010f6af:
    *error = Read;
    return false;
  }
  local_890.fixed_buffer_ = (char *)&local_838;
  local_890.fixed_buffer_size_ = 0x800;
  local_890.fixed_buffer_used_size_ = 0;
  local_890.glowable_buffer_._M_string_length = 0;
  local_890.glowable_buffer_.field_2._M_local_buf[0] = '\0';
  __n = extraout_RDX;
  local_890.strm_ = strm;
  local_890.glowable_buffer_._M_dataplus._M_p = (pointer)((long)&local_890 + 0x30U);
  local_850 = error;
  local_848 = this;
  local_840 = (Request *)res;
  while( true ) {
    _Var5 = detail::stream_line_reader::getline(&local_890,(char **)__lineptr,__n,(FILE *)__stream);
    if ((char)_Var5 == '\0') break;
    sVar6 = local_890.glowable_buffer_._M_string_length;
    puVar1 = (undefined1 *)((long)&local_890 + 0x18);
    if (local_890.glowable_buffer_._M_string_length == 0) {
      sVar6 = local_890.fixed_buffer_used_size_;
      puVar1 = (undefined1 *)&local_890;
    }
    __stream = (Response *)((long)puVar1 + 8);
    __n = extraout_RDX_00;
    if (1 < sVar6) {
      __lineptr = (Stream *)(*(char **)__stream + sVar6);
      if ((*(char *)((long)&__lineptr[-1]._vptr_Stream + 6) == '\r') &&
         (*(char *)((long)&__lineptr[-1]._vptr_Stream + 7) == '\n')) {
        if (sVar6 == 2) break;
        __lineptr = (Stream *)((long)&__lineptr[-1]._vptr_Stream + 6);
        detail::
        parse_header<httplib::detail::read_headers(httplib::Stream&,std::multimap<std::__cxx11::string,std::__cxx11::string,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>&)::_lambda(std::__cxx11::string&&,std::__cxx11::string&&)_1_>
                  (*(char **)__stream,(char *)__lineptr,(anon_class_8_1_b2c1a266)&res->headers);
        __n = extraout_RDX_01;
      }
    }
  }
  if (local_890.glowable_buffer_._M_dataplus._M_p != (pointer)((long)&local_890 + 0x30U)) {
    operator_delete(local_890.glowable_buffer_._M_dataplus._M_p,
                    CONCAT71(local_890.glowable_buffer_.field_2._M_allocated_capacity._1_7_,
                             local_890.glowable_buffer_.field_2._M_local_buf[0]) + 1);
  }
  x = local_840;
  this_00 = local_848;
  pEVar2 = local_850;
  error = local_850;
  if ((char)_Var5 == '\0') goto LAB_0010f6af;
  if (((req->response_handler_).super__Function_base._M_manager != (_Manager_type)0x0) &&
     (bVar3 = (*(req->response_handler_)._M_invoker)
                        ((_Any_data *)&req->response_handler_,(Response *)local_840), !bVar3)) {
    *pEVar2 = Canceled;
    return false;
  }
  if ((*(int *)&(x->path)._M_dataplus._M_p != 0xcc) &&
     ((iVar4 = std::__cxx11::string::compare((char *)req), iVar4 != 0 &&
      (iVar4 = std::__cxx11::string::compare((char *)req), iVar4 != 0)))) {
    local_838._8_8_ = (Error *)0x0;
    if ((req->content_receiver_).super__Function_base._M_manager == (_Manager_type)0x0) {
      local_838._M_allocated_capacity = (size_type)x;
      pcVar7 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5708:8)>
               ::_M_manager;
      local_8a0 = std::
                  _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5708:8)>
                  ::_M_invoke;
    }
    else {
      local_838._8_8_ = pEVar2;
      pcVar7 = std::
               _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5702:8)>
               ::_M_manager;
      local_8a0 = std::
                  _Function_handler<bool_(const_char_*,_unsigned_long,_unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5702:8)>
                  ::_M_invoke;
      local_838._M_allocated_capacity = (size_type)req;
    }
    local_8d8._8_8_ = pEVar2;
    pcStack_8c0 = std::
                  _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5717:20)>
                  ::_M_invoke;
    local_8c8 = std::
                _Function_handler<bool_(unsigned_long,_unsigned_long),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/junaidrahim[P]locate-route/src/../include/httplib.h:5717:20)>
                ::_M_manager;
    local_8b8._M_unused._M_object = (Request *)0x0;
    local_8b8._8_8_ = (Error *)0x0;
    local_8a8 = (code *)0x0;
    local_828[0]._0_8_ = pcVar7;
    local_828[0]._8_8_ = local_8a0;
    if (pcVar7 != (code *)0x0) {
      local_8b8._M_unused._M_object = (void *)local_838._M_allocated_capacity;
      local_8b8._8_8_ = local_838._8_8_;
      local_828[0]._M_allocated_capacity = (code *)0x0;
      local_828[0]._8_8_ = (code *)0x0;
      local_8a8 = pcVar7;
    }
    local_8d8._M_unused._M_object = req;
    bVar3 = detail::read_content<httplib::Response>
                      (strm,(Response *)x,0xffffffffffffffff,(int *)&local_890,
                       (Progress *)&local_8d8,(ContentReceiverWithProgress *)&local_8b8,
                       this_00->decompress_);
    if (local_8a8 != (code *)0x0) {
      (*local_8a8)(&local_8b8,&local_8b8,3);
    }
    if (local_8c8 != (code *)0x0) {
      (*local_8c8)(&local_8d8,&local_8d8,__destroy_functor);
    }
    if (*pEVar2 != Canceled && !bVar3) {
      *pEVar2 = Read;
    }
    if ((code *)local_828[0]._0_8_ != (code *)0x0) {
      (*(code *)local_828[0]._0_8_)(&local_838,&local_838,3);
    }
    if (!bVar3) {
      return false;
    }
  }
  local_838._M_allocated_capacity = (size_type)local_828;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_838,"Connection","");
  pVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::equal_range(&(res->headers)._M_t,(key_type *)&local_838);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_838._M_allocated_capacity != local_828) {
    operator_delete((void *)local_838._M_allocated_capacity,
                    (ulong)(local_828[0]._M_allocated_capacity + 1));
  }
  if (pVar8.first._M_node._M_node == pVar8.second._M_node._M_node) {
    __s = "";
  }
  else {
    __s = *(char **)(pVar8.first._M_node._M_node + 2);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_890,__s,(allocator<char> *)local_838._M_local_buf);
  iVar4 = std::__cxx11::string::compare((char *)&local_890);
  if (iVar4 == 0) {
    if (local_890.strm_ != (Stream *)((long)&local_890 + 0x10)) {
      operator_delete(local_890.strm_,local_890.fixed_buffer_size_ + 1);
    }
  }
  else {
    iVar4 = std::__cxx11::string::compare((char *)x);
    if (iVar4 != 0) {
      if (local_890.strm_ != (Stream *)((long)&local_890 + 0x10)) {
        operator_delete(local_890.strm_,local_890.fixed_buffer_size_ + 1);
      }
      goto LAB_0010f916;
    }
    iVar4 = std::__cxx11::string::compare((char *)&(x->path)._M_string_length);
    if (local_890.strm_ != (Stream *)((long)&local_890 + 0x10)) {
      operator_delete(local_890.strm_,local_890.fixed_buffer_size_ + 1);
    }
    if (iVar4 == 0) goto LAB_0010f916;
  }
  lock_socket_and_shutdown_and_close(this_00);
LAB_0010f916:
  if ((this_00->logger_).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this_00->logger_)._M_invoker)((_Any_data *)&this_00->logger_,req,(Response *)x);
    return true;
  }
  return true;
}

Assistant:

inline bool ClientImpl::process_request(Stream &strm, const Request &req,
											Response &res, bool close_connection,
											Error &error) {
		// Send request
		if (!write_request(strm, req, close_connection, error)) { return false; }

		// Receive response and headers
		if (!read_response_line(strm, req, res) ||
			!detail::read_headers(strm, res.headers)) {
			error = Error::Read;
			return false;
		}

		if (req.response_handler_) {
			if (!req.response_handler_(res)) {
				error = Error::Canceled;
				return false;
			}
		}

		// Body
		if ((res.status != 204) && req.method != "HEAD" && req.method != "CONNECT") {
			auto out =
					req.content_receiver_
					? static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t off, uint64_t len) {
								auto ret = req.content_receiver_(buf, n, off, len);
								if (!ret) { error = Error::Canceled; }
								return ret;
							})
					: static_cast<ContentReceiverWithProgress>(
							[&](const char *buf, size_t n, uint64_t /*off*/,
								uint64_t /*len*/) {
								if (res.body.size() + n > res.body.max_size()) {
									return false;
								}
								res.body.append(buf, n);
								return true;
							});

			auto progress = [&](uint64_t current, uint64_t total) {
				if (!req.progress_) { return true; }
				auto ret = req.progress_(current, total);
				if (!ret) { error = Error::Canceled; }
				return ret;
			};

			int dummy_status;
			if (!detail::read_content(strm, res, (std::numeric_limits<size_t>::max)(),
									  dummy_status, std::move(progress), std::move(out),
									  decompress_)) {
				if (error != Error::Canceled) { error = Error::Read; }
				return false;
			}
		}

		if (res.get_header_value("Connection") == "close" ||
			(res.version == "HTTP/1.0" && res.reason != "Connection established")) {
			// TODO this requires a not-entirely-obvious chain of calls to be correct
			// for this to be safe. Maybe a code refactor (such as moving this out to
			// the send function and getting rid of the recursiveness of the mutex)
			// could make this more obvious.

			// This is safe to call because process_request is only called by
			// handle_request which is only called by send, which locks the request
			// mutex during the process. It would be a bug to call it from a different
			// thread since it's a thread-safety issue to do these things to the socket
			// if another thread is using the socket.
			lock_socket_and_shutdown_and_close();
		}

		// Log
		if (logger_) { logger_(req, res); }

		return true;
	}